

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_CheckOneofMessageFieldIsCleared_Test::TestBody
          (Proto3ArenaTest_CheckOneofMessageFieldIsCleared_Test *this)

{
  long lVar1;
  TestAllTypes *this_00;
  TestAllTypes_NestedMessage *pTVar2;
  pointer *__ptr;
  Arena *arena_00;
  char *message;
  AssertionResult gtest_ar;
  Arena arena;
  Message local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  ThreadSafeArena local_b8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b8);
  this_00 = (TestAllTypes *)
            Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>((Arena *)&local_b8);
  if ((this_00->field_0)._impl_._oneof_case_[0] != 0x70) {
    proto3_arena_unittest::TestAllTypes::clear_oneof_field(this_00);
    (this_00->field_0)._impl_._oneof_case_[0] = 0x70;
    arena_00 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena_00 & 1) != 0) {
      arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
    }
    pTVar2 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(arena_00);
    (this_00->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar2;
  }
  lVar1 = *(long *)((long)&this_00->field_0 + 0x318);
  *(undefined4 *)(lVar1 + 0x18) = 100;
  *(byte *)(lVar1 + 0x10) = *(byte *)(lVar1 + 0x10) | 1;
  proto3_arena_unittest::TestAllTypes::Clear(this_00);
  local_d8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = *(undefined4 *)(lVar1 + 0x18);
  local_d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_c8,"child->bb()","0",(int *)&local_d8,(int *)&local_d0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message(&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
               ,0x127,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)CONCAT44(local_d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b8);
  return;
}

Assistant:

TEST(Proto3ArenaTest, CheckOneofMessageFieldIsCleared) {
  if (!internal::DebugHardenClearOneofMessageOnArena()) {
    GTEST_SKIP() << "arena allocated oneof message fields are not hardened.";
  }

  Arena arena;
  auto msg = Arena::Create<TestAllTypes>(&arena);

  // Referring to a saved pointer to a child message is never guaranteed to
  // work. IOW, protobufs do not guarantee pointer stability. This test only
  // does this to replicate (unsupported) user behaviors.
  auto child = msg->mutable_oneof_nested_message();
  child->set_bb(100);
  msg->Clear();

  if (internal::HasMemoryPoisoning()) {
#if GTEST_HAS_DEATH_TEST
    EXPECT_DEATH(EXPECT_EQ(child->bb(), 100), "use-after-poison");
#endif  // !GTEST_HAS_DEATH_TEST
  } else {
    EXPECT_EQ(child->bb(), 0);
  }
}